

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentRecord.cpp
# Opt level: O1

void __thiscall
AlignmentRecord::AlignmentRecord
          (AlignmentRecord *this,BamAlignment *alignment,int readRef,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *rnm,string *mainReference)

{
  pointer *ppcVar1;
  _Rb_tree_header *p_Var2;
  pointer pCVar3;
  iterator __position;
  pointer pmVar4;
  ShortDnaSequence *this_00;
  char cVar5;
  byte bVar6;
  uint uVar7;
  size_t sVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  AlignmentRecord *this_01;
  pointer __args;
  vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *__range1;
  string querySequence;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
  ref1;
  int local_1bc;
  vector<int,_std::allocator<int>_> *local_1b8;
  string *local_1b0;
  string *local_1a8;
  ShortDnaSequence *local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_160;
  set<int,_std::less<int>,_std::allocator<int>_> *local_158;
  vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *local_150;
  ShortDnaSequence *local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_140;
  string *local_138;
  string *local_130;
  ShortDnaSequence local_128;
  string local_e0;
  vector<char,_std::allocator<char>_> local_c0;
  string local_a8;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
  local_88;
  
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  local_1a0 = &this->sequence1;
  (this->cigar1).super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cigar1).super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cigar1).super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1bc = readRef;
  local_130 = mainReference;
  ShortDnaSequence::ShortDnaSequence(local_1a0);
  local_140 = &(this->al_sequence1).field_2;
  (this->al_sequence1)._M_dataplus._M_p = (pointer)local_140;
  (this->al_sequence1)._M_string_length = 0;
  (this->al_sequence1).field_2._M_local_buf[0] = '\0';
  local_148 = &this->sequence2;
  (this->cigar2).super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cigar2).super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cigar2).super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->cigar2_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cigar2_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cigar2_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ShortDnaSequence::ShortDnaSequence(local_148);
  (this->cov_pos).
  super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cov_pos).
  super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cov_pos).
  super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_158 = &this->readNames;
  p_Var2 = &(this->readNames)._M_t._M_impl.super__Rb_tree_header;
  (this->readNames)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->readNames)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->readNames)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->readNames)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->readNames)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->readNameMap = rnm;
  (this->consistingReads).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->consistingReads).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->consistingReads).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1a8 = (string *)&this->reference_seq1;
  local_160 = &(this->reference_seq1).field_2;
  (this->reference_seq1)._M_dataplus._M_p = (pointer)local_160;
  (this->reference_seq1)._M_string_length = 0;
  (this->reference_seq1).field_2._M_local_buf[0] = '\0';
  local_168 = &(this->reference_seq2).field_2;
  (this->reference_seq2)._M_dataplus._M_p = (pointer)local_168;
  (this->reference_seq2)._M_string_length = 0;
  (this->reference_seq2).field_2._M_local_buf[0] = '\0';
  local_1b0 = (string *)&this->alignSequence1;
  local_170 = &(this->alignSequence1).field_2;
  (this->alignSequence1)._M_dataplus._M_p = (pointer)local_170;
  (this->alignSequence1)._M_string_length = 0;
  (this->alignSequence1).field_2._M_local_buf[0] = '\0';
  local_178 = &(this->alignSequence2).field_2;
  (this->alignSequence2)._M_dataplus._M_p = (pointer)local_178;
  (this->alignSequence2)._M_string_length = 0;
  (this->alignSequence2).field_2._M_local_buf[0] = '\0';
  local_180 = &(this->code1).field_2;
  (this->code1)._M_dataplus._M_p = (pointer)local_180;
  (this->code1)._M_string_length = 0;
  (this->code1).field_2._M_local_buf[0] = '\0';
  local_188 = &(this->code2).field_2;
  (this->code2)._M_dataplus._M_p = (pointer)local_188;
  (this->code2)._M_string_length = 0;
  (this->code2).field_2._M_local_buf[0] = '\0';
  local_190 = &(this->gcQuality1).field_2;
  (this->gcQuality1)._M_dataplus._M_p = (pointer)local_190;
  (this->gcQuality1)._M_string_length = 0;
  (this->gcQuality1).field_2._M_local_buf[0] = '\0';
  local_198 = &(this->gcQuality2).field_2;
  (this->gcQuality2)._M_dataplus._M_p = (pointer)local_198;
  (this->gcQuality2)._M_string_length = 0;
  (this->gcQuality2).field_2._M_local_buf[0] = '\0';
  local_1b8 = &this->qualityList1;
  this->support = 0;
  this->uniqueSupport = 0;
  (this->qualityList2).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->qualityList2).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  (this->qualityList1).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  (this->qualityList2).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->qualityList1).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->qualityList1).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  this->single_end = true;
  local_150 = &this->cigar1;
  std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
  _M_insert_unique<int_const&>
            ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)local_158,
             &local_1bc);
  std::__cxx11::string::_M_assign((string *)this);
  this->start1 = *(int *)(alignment + 0xac) + 1;
  uVar7 = BamTools::BamAlignment::GetEndPosition(SUB81(alignment,0),false);
  this->end1 = uVar7;
  std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::operator=
            (&this->cigar1,
             (vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)(alignment + 0xb8));
  this->support = 0;
  this->uniqueSupport = 0;
  local_138 = (string *)(alignment + 0x68);
  if (*(long *)(alignment + 0x70) == 0) {
    iVar9 = 0;
  }
  else {
    lVar11 = 0;
    iVar9 = 0;
    do {
      iVar9 = iVar9 + (local_138->_M_dataplus)._M_p[lVar11] + -0x21;
      lVar11 = lVar11 + 1;
    } while (*(long *)(alignment + 0x70) != lVar11);
  }
  this->phred_sum1 = iVar9;
  pCVar3 = (this->cigar1).super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (__args = (this->cigar1).
                super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
                super__Vector_impl_data._M_start; __args != pCVar3; __args = __args + 1) {
    uVar7 = __args->Length;
    if (uVar7 != 0) {
      uVar10 = 0;
      do {
        __position._M_current =
             (this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                    ((vector<char,std::allocator<char>> *)&this->cigar1_unrolled,__position,
                     &__args->Type);
        }
        else {
          *__position._M_current = __args->Type;
          ppcVar1 = &(this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl
                     .super__Vector_impl_data._M_finish;
          *ppcVar1 = *ppcVar1 + 1;
        }
        uVar10 = uVar10 + 1;
        uVar7 = __args->Length;
      } while (uVar10 < uVar7);
    }
    if ((__args->Type == 'D') &&
       (this->length_incl_deletions1 = this->length_incl_deletions1 + uVar7, 1 < uVar7)) {
      this->length_incl_longdeletions1 = this->length_incl_longdeletions1 + uVar7;
    }
  }
  cVar5 = BamTools::BamAlignment::IsPaired();
  if (cVar5 == '\0') {
    bVar6 = BamTools::BamAlignment::IsReverseStrand();
    this->strand1 = (bool)(bVar6 ^ 1);
    goto LAB_00166308;
  }
  cVar5 = BamTools::BamAlignment::IsFirstMate();
  if (cVar5 == '\0') {
    cVar5 = BamTools::BamAlignment::IsSecondMate();
    if (cVar5 == '\0') goto LAB_00166308;
    cVar5 = BamTools::BamAlignment::IsReverseStrand();
    if (cVar5 != '\0') goto LAB_00166301;
  }
  else {
    cVar5 = BamTools::BamAlignment::IsReverseStrand();
    if (cVar5 == '\0') {
LAB_00166301:
      this->strand1 = true;
      goto LAB_00166308;
    }
  }
  this->strand1 = false;
LAB_00166308:
  this->refId = *(int *)(alignment + 0xa8);
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e0,*(long *)(alignment + 0x28),
             *(long *)(alignment + 0x30) + *(long *)(alignment + 0x28));
  std::vector<char,_std::allocator<char>_>::vector(&local_c0,&this->cigar1_unrolled);
  iVar9 = *(int *)(alignment + 0xac);
  this_01 = *(AlignmentRecord **)(alignment + 0x68);
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,this_01,
             (long)&(this_01->name)._M_dataplus._M_p + *(long *)(alignment + 0x70));
  this_00 = local_1a0;
  referenceString(&local_88,this_01,&local_c0,iVar9,&local_e0,&local_a8,local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if (local_c0.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_c0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  ShortDnaSequence::ShortDnaSequence(&local_128,&local_e0,local_138);
  boost::
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator=(&(this->sequence1).forward,&local_128.forward);
  boost::
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator=(&(this->sequence1).forward_qualities,&local_128.forward_qualities);
  boost::
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator=(&(this->sequence1).backward,&local_128.backward);
  boost::
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator=(&(this->sequence1).backward_qualities,&local_128.backward_qualities);
  ShortDnaSequence::~ShortDnaSequence(&local_128);
  std::__cxx11::string::_M_assign(local_1a8);
  std::__cxx11::string::_M_assign(local_1b0);
  std::vector<int,_std::allocator<int>_>::operator=
            (local_1b8,(vector<int,_std::allocator<int>_> *)&local_88);
  sVar8 = ShortDnaSequence::size(this_00);
  this->length_incl_deletions1 = (int)sVar8;
  sVar8 = ShortDnaSequence::size(this_00);
  this->length_incl_longdeletions1 = (int)sVar8;
  coveredPositions((vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_> *)
                   &local_128,this);
  pmVar4 = (this->cov_pos).
           super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>
           ._M_impl.super__Vector_impl_data._M_start;
  (this->cov_pos).
  super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_128._vptr_ShortDnaSequence;
  (this->cov_pos).
  super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_128.forward.px;
  (this->cov_pos).
  super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_128.forward.pn.pi_;
  local_128._vptr_ShortDnaSequence = (_func_int **)0x0;
  local_128.forward.px = (element_type *)0x0;
  local_128.forward.pn.pi_ = (sp_counted_base *)0x0;
  if (pmVar4 != (pointer)0x0) {
    operator_delete(pmVar4);
  }
  if (local_128._vptr_ShortDnaSequence != (_func_int **)0x0) {
    operator_delete(local_128._vptr_ShortDnaSequence);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
         ._M_head_impl._M_dataplus._M_p !=
      &local_88.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
       ._M_head_impl.field_2) {
    operator_delete(local_88.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                    ._M_head_impl._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
         .
         super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
         .
         super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
         ._M_head_impl._M_dataplus._M_p !=
      &local_88.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
       .
       super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
       .
       super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
       ._M_head_impl.field_2) {
    operator_delete(local_88.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                    .
                    super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                    .
                    super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                    ._M_head_impl._M_dataplus._M_p);
  }
  if (local_88.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
      .
      super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
      .super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
      super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(local_88.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                    .
                    super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                    .super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
                    super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>.
                    _M_head_impl.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  return;
}

Assistant:

AlignmentRecord::AlignmentRecord(const BamTools::BamAlignment& alignment, int readRef, vector<string>* rnm , string &mainReference) : readNameMap(rnm) {

    this->single_end = true;
    this->readNames.insert(readRef);
    this->name = alignment.Name;
    this->start1 = alignment.Position + 1;
    this->end1 = alignment.GetEndPosition();
    this->cigar1 = alignment.CigarData;
    this->uniqueSupport = 0;
    this->support = 0;

    this->phred_sum1 = phred_sum(alignment.Qualities);
    //Constructing the unrolled cigar strings
    for (const auto& it : cigar1) {
        for (unsigned int s = 0; s < it.Length; ++s) {
            this->cigar1_unrolled.push_back(it.Type);
        }
        if (it.Type == 'D') {
            this->length_incl_deletions1+=it.Length;
            if (it.Length > 1) {
                this->length_incl_longdeletions1+=it.Length;
            }
        }
    }

    //NoMe Additions
    //Determines if the alignment is forward or reverse stranded
    if(!alignment.IsPaired()){
    this->strand1 = !alignment.IsReverseStrand();
    }else{
        if(alignment.IsFirstMate()){
            if(!alignment.IsReverseStrand()){
                this->strand1=true;
            }else{
                this->strand1=false;
            }
        }else if(alignment.IsSecondMate()){
            if(alignment.IsReverseStrand()){
                this->strand1=true;
            }else{
                this->strand1=false;
            }
        }
    }
    this->refId=alignment.RefID;
    string querySequence = alignment.QueryBases;
    //Reference string returns the reference, the aligned sequence and the quality list
    auto ref1 = referenceString(this->getCigar1Unrolled(),alignment.Position,querySequence,alignment.Qualities,mainReference);
    this->sequence1 = ShortDnaSequence(querySequence, alignment.Qualities);

    this->reference_seq1 = std::get<0>(ref1);
    this->alignSequence1=std::get<1>(ref1);
    this->qualityList1 = std::get<2>(ref1);
    this->length_incl_deletions1 = this->sequence1.size();
    this->length_incl_longdeletions1 = this->sequence1.size();

    //End Nome additions



    this->cov_pos = this->coveredPositions();
}